

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O2

bool __thiscall xray_re::xr_skl_motion::load_skl(xr_skl_motion *this,char *path)

{
  xr_file_system *this_00;
  xr_reader *this_01;
  xr_reader *s;
  xr_reader *local_18;
  
  this_00 = xr_file_system::instance();
  this_01 = xr_file_system::r_open(this_00,path);
  if (this_01 != (xr_reader *)0x0) {
    local_18 = xr_reader::open_chunk(this_01,0x1200);
    if (local_18 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_skl_motion.cxx"
                    ,0xbc,"bool xray_re::xr_skl_motion::load_skl(const char *)");
    }
    (*(this->super_xr_motion)._vptr_xr_motion[2])(this,local_18);
    xr_reader::close_chunk(this_01,&local_18);
    (*this_01->_vptr_xr_reader[1])(this_01);
  }
  return this_01 != (xr_reader *)0x0;
}

Assistant:

bool xr_skl_motion::load_skl(const char* path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path);
	if (r == 0)
		return false;
	xr_reader* s = r->open_chunk(EOBJ_CHUNK_SMOTION);
	xr_assert(s);
	load(*s);
	r->close_chunk(s);
	fs.r_close(r);
	return true;
}